

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsIntersectSorted(int n1,int n2,FmsInt *face1,FmsInt *face2,FmsInt *edge_common)

{
  int iVar1;
  FmsInt FVar2;
  int iVar3;
  int iVar4;
  FmsInt FVar5;
  ulong *puVar6;
  
  FVar5 = *face1;
  FVar2 = *face2;
  iVar1 = 0;
  iVar3 = 0;
  iVar4 = 0;
  do {
    while( true ) {
      if (FVar5 == FVar2) break;
      if (FVar5 < FVar2) {
        puVar6 = face1 + (long)iVar3 + 1;
        do {
          if (n1 + -1 == iVar3) {
            return iVar1;
          }
          FVar5 = *puVar6;
          puVar6 = puVar6 + 1;
          iVar3 = iVar3 + 1;
        } while (FVar5 < FVar2);
      }
      else {
        puVar6 = face2 + (long)iVar4 + 1;
        do {
          if (n2 + -1 == iVar4) {
            return iVar1;
          }
          FVar2 = *puVar6;
          puVar6 = puVar6 + 1;
          iVar4 = iVar4 + 1;
        } while (FVar2 < FVar5);
      }
    }
    iVar1 = iVar1 + 1;
    *edge_common = FVar5;
    puVar6 = face2 + (long)iVar4 + 1;
    do {
      if (n2 + -1 == iVar4) {
        return iVar1;
      }
      FVar2 = *puVar6;
      puVar6 = puVar6 + 1;
      iVar4 = iVar4 + 1;
    } while (FVar5 == FVar2);
    puVar6 = face1 + (long)iVar3 + 1;
    do {
      if (n1 + -1 == iVar3) {
        return iVar1;
      }
      FVar5 = *puVar6;
      puVar6 = puVar6 + 1;
      iVar3 = iVar3 + 1;
    } while (FVar5 < FVar2);
  } while( true );
}

Assistant:

static inline int FmsIntersectSorted(int n1, int n2, FmsInt *face1,
                                     FmsInt *face2, FmsInt *edge_common) {
  int num_common = 0;
  FmsInt e1 = face1[0], e2 = face2[0];
  for (int i1 = 0, i2 = 0; 1; ) {
    if (e1 == e2) {
      num_common++;
      *edge_common = e1;
      do {
        if (++i2 == n2) { return num_common; }
        e2 = face2[i2];
      } while (e1 == e2);
      do {
        if (++i1 == n1) { return num_common; }
        e1 = face1[i1];
      } while (e1 < e2);
    } else if (e1 < e2) {
      do {
        if (++i1 == n1) { return num_common; }
        e1 = face1[i1];
      } while (e1 < e2);
    } else { // e1 > e2
      do {
        if (++i2 == n2) { return num_common; }
        e2 = face2[i2];
      } while (e1 > e2);
    }
  }
  // not reachable
}